

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

void __thiscall bsim::bit_vector<17>::bit_vector(bit_vector<17> *this,string *str)

{
  long lVar1;
  char *pcVar2;
  ulong in_RSI;
  bit_vector<17> *in_RDI;
  int ind;
  uchar val;
  int i;
  int local_14;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0x11) {
    for (local_14 = 0x10; -1 < local_14; local_14 = local_14 + -1) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      set(in_RDI,0x10 - local_14,*pcVar2 != '0');
    }
    return;
  }
  __assert_fail("str.size() == N",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/bit_vector.h"
                ,0x26,"bsim::bit_vector<17>::bit_vector(const std::string &) [N = 17]");
}

Assistant:

bit_vector(const std::string& str) {
      assert(str.size() == N);

      for (int i = N - 1; i >= 0; i--) {
	unsigned char val = (str[i] == '0') ? 0 : 1;
	int ind = N - i - 1;
	set(ind, val);
      }
    }